

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>
fmt::v8::detail::write<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
          (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out,wchar_t *s,
          basic_format_specs<wchar_t> *specs,locale_ref param_4)

{
  presentation_type pVar1;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> bVar2;
  size_t sVar3;
  basic_string_view<wchar_t> s_00;
  
  pVar1 = specs->type;
  if ((1 < pVar1 - 0x10) && (pVar1 != none)) {
    fmt::v8::detail::throw_format_error("invalid type specifier");
  }
  if ((pVar1 & ~string) != none) {
    bVar2 = write_ptr<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_long>
                      (out,(unsigned_long)s,specs);
    return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar2.container;
  }
  sVar3 = wcslen(s);
  s_00.size_ = sVar3;
  s_00.data_ = s;
  bVar2 = write<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                    (out,s_00,specs,(locale_ref)0x0);
  return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar2.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, const Char* s,
                         const basic_format_specs<Char>& specs, locale_ref)
    -> OutputIt {
  return check_cstring_type_spec(specs.type)
             ? write(out, basic_string_view<Char>(s), specs, {})
             : write_ptr<Char>(out, to_uintptr(s), &specs);
}